

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void V_unite_cube_extraction
               (tetgenio *out,int *draw_check,double *total_distance,double *draw_points,
               int *draw_check_array,int *num_draw_points,float *x1,float *y1,float *z1,float *x2,
               float *y2,float *z2,int *draw_index,int *point_index)

{
  float fVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  voroedge *pvVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  double local_70;
  int boundary;
  double *local_60;
  int *local_58;
  double local_50;
  double *local_48;
  int *local_40;
  int *local_38;
  
  *total_distance = 0.0;
  *draw_index = 0;
  *point_index = 0;
  *num_draw_points = 0;
  if (0 < out->numberofvedges) {
    local_70 = 100.0;
    lVar9 = 0x18;
    lVar8 = 0;
    local_60 = total_distance;
    local_58 = draw_check;
    local_48 = draw_points;
    local_40 = draw_check_array;
    local_38 = num_draw_points;
    do {
      pdVar4 = out->vpointlist;
      pvVar5 = out->vedgelist;
      lVar7 = (long)*(int *)((long)pvVar5->vnormal + lVar9 + -0x20);
      *x1 = (float)pdVar4[lVar7 * 3];
      *y1 = (float)pdVar4[lVar7 * 3 + 1];
      *z1 = (float)pdVar4[lVar7 * 3 + 2];
      lVar7 = (long)*(int *)((long)pvVar5->vnormal + lVar9 + -0x1c);
      if (lVar7 == -1) {
        pdVar6 = (double *)((long)pvVar5->vnormal + lVar9 + -8);
        *x2 = (float)*(double *)((long)pvVar5->vnormal + lVar9 + -0x18);
        dVar10 = *(double *)((long)pvVar5->vnormal + lVar9 + -0x10);
      }
      else {
        *x2 = (float)pdVar4[lVar7 * 3];
        iVar2 = *(int *)((long)pvVar5->vnormal + lVar9 + -0x1c);
        pdVar6 = pdVar4 + (long)iVar2 * 3 + 2;
        dVar10 = pdVar4[(long)iVar2 * 3 + 1];
      }
      *y2 = (float)dVar10;
      fVar11 = (float)*pdVar6;
      *z2 = fVar11;
      fVar1 = *x1;
      if (((((((fVar1 <= 1.0) && (*y1 <= 1.0)) && (0.0 <= *z1)) && ((0.0 <= *y1 && (0.0 <= fVar1))))
           && (*z1 <= 1.0)) ||
          (((*x2 <= 1.0 && (*y2 <= 1.0)) &&
           ((0.0 <= fVar11 && (((fVar11 <= 1.0 && (0.0 <= *x2)) && (0.0 <= *y2)))))))) &&
         ((*(int *)((long)pvVar5->vnormal + lVar9 + -0x1c) != -1 ||
          ((((fVar1 < 1.0 && (*y1 < 1.0)) && ((0.0 < *z1 && ((0.0 < *y1 && (0.0 < fVar1)))))) &&
           (*z1 < 1.0)))))) {
        boundary = 0;
        trim(x1,y1,z1,x2,y2,z2,&boundary,local_58);
        dVar10 = ((double)*z2 - (double)*z1) * ((double)*z2 - (double)*z1) +
                 ((double)*x2 - (double)*x1) * ((double)*x2 - (double)*x1) +
                 ((double)*y2 - (double)*y1) * ((double)*y2 - (double)*y1);
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if (dVar10 < _x0 * 0.5) {
          dVar10 = ((double)*z2 - (double)*z1) * ((double)*z2 - (double)*z1) +
                   ((double)*x2 - (double)*x1) * ((double)*x2 - (double)*x1) +
                   ((double)*y2 - (double)*y1) * ((double)*y2 - (double)*y1);
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          if (dVar10 * 0.25 < local_70) {
            local_70 = ((double)*z2 - (double)*z1) * ((double)*z2 - (double)*z1) +
                       ((double)*x2 - (double)*x1) * ((double)*x2 - (double)*x1) +
                       ((double)*y2 - (double)*y1) * ((double)*y2 - (double)*y1);
            if (local_70 < 0.0) {
              local_70 = sqrt(local_70);
            }
            else {
              local_70 = SQRT(local_70);
            }
            local_70 = local_70 * 0.25;
          }
          dVar10 = ((double)*z2 - (double)*z1) * ((double)*z2 - (double)*z1) +
                   ((double)*x2 - (double)*x1) * ((double)*x2 - (double)*x1) +
                   ((double)*y2 - (double)*y1) * ((double)*y2 - (double)*y1);
          if (dVar10 < 0.0) {
            local_50 = *local_60;
            dVar10 = sqrt(dVar10);
            dVar12 = local_50;
          }
          else {
            dVar10 = SQRT(dVar10);
            dVar12 = *local_60;
          }
          *local_60 = dVar10 * 0.25 + dVar12;
          fVar1 = *x1;
          iVar2 = *point_index;
          *point_index = iVar2 + 1;
          local_48[iVar2] = (double)fVar1 * 0.25;
          fVar1 = *y1;
          *point_index = iVar2 + 2;
          local_48[(long)iVar2 + 1] = (double)fVar1 * 0.25;
          fVar1 = *z1;
          *point_index = iVar2 + 3;
          local_48[(long)iVar2 + 2] = (double)fVar1 * 0.25;
          fVar1 = *x2;
          *point_index = iVar2 + 4;
          local_48[(long)iVar2 + 3] = (double)fVar1 * 0.25;
          fVar1 = *y2;
          *point_index = iVar2 + 5;
          local_48[(long)iVar2 + 4] = (double)fVar1 * 0.25;
          fVar1 = *z2;
          *point_index = iVar2 + 6;
          local_48[(long)iVar2 + 5] = (double)fVar1 * 0.25;
          *local_38 = *local_38 + 1;
          iVar2 = *local_58;
          iVar3 = *draw_index;
          *draw_index = iVar3 + 1;
          local_40[iVar3] = iVar2;
        }
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x20;
    } while (lVar8 < out->numberofvedges);
  }
  return;
}

Assistant:

void V_unite_cube_extraction(tetgenio &out, int &draw_check, double &total_distance, double *draw_points, int *draw_check_array, int &num_draw_points,
							 float &x1, float &y1, float &z1, float &x2, float &y2, float &z2, int &draw_index, int &point_index)
{
	total_distance = 0;
	draw_index = 0;
	point_index = 0;
	num_draw_points = 0;
	double min_strut = 100;
	for (int i = 0; i < out.numberofvedges; i++)
	{
		x1 = out.vpointlist[3 * out.vedgelist[i].v1];
		y1 = out.vpointlist[3 * out.vedgelist[i].v1 + 1];
		z1 = out.vpointlist[3 * out.vedgelist[i].v1 + 2];

		if (out.vedgelist[i].v2 == -1.0)
		{
			x2 = out.vedgelist[i].vnormal[0];
			y2 = out.vedgelist[i].vnormal[1];
			z2 = out.vedgelist[i].vnormal[2];
			//cout<<"edge "<<i<<endl;
		}
		else
		{
			x2 = out.vpointlist[3 * out.vedgelist[i].v2];
			y2 = out.vpointlist[3 * out.vedgelist[i].v2 + 1];
			z2 = out.vpointlist[3 * out.vedgelist[i].v2 + 2];
		}

		// check if the line located inside the unit cube
		if ((x1 > 1.0 || y1 > 1.0 || z1 > 1.0 || x1 < 0.0 || y1 < 0.0 || z1 < 0.0) && (x2 > 1.0 || y2 > 1.0 || z2 > 1.0 || x2 < 0.0 || y2 < 0.0 || z2 < 0.0))
		{
		}
		else if ((out.vedgelist[i].v2 == -1.0) && (x1 >= 1.0 || y1 >= 1.0 || z1 >= 1.0 || x1 <= 0.0 || y1 <= 0.0 || z1 <= 0.0))
		{
		}
		else
		{
			int boundary = 0;
			trim(x1, y1, z1, x2, y2, z2, boundary, draw_check);

			if (dist_two_points_3d(x1, y1, z1, x2, y2, z2) < _x0 / 2)
			{
				if (dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25 < min_strut)
				{
					min_strut = dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25;
				}
				total_distance = total_distance + dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25;
				draw_points[point_index++] = x1 * 0.25;
				draw_points[point_index++] = y1 * 0.25;
				draw_points[point_index++] = z1 * 0.25;
				draw_points[point_index++] = x2 * 0.25;
				draw_points[point_index++] = y2 * 0.25;
				draw_points[point_index++] = z2 * 0.25;
				num_draw_points++;
				draw_check_array[draw_index++] = draw_check;
			}
		}
	}
}